

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O1

void glesv2_gears_term(gears_t_conflict1 *gears)

{
  GLubyte *pGVar1;
  
  if (gears != (gears_t_conflict1 *)0x0) {
    if (gears->gear[2] != (gear_conflict *)0x0) {
      delete_gear(gears,2);
    }
    if (gears->gear[1] != (gear_conflict *)0x0) {
      delete_gear(gears,1);
    }
    if (gears->gear[0] != (gear_conflict *)0x0) {
      delete_gear(gears,0);
    }
    if (gears->program != 0) {
      (*gears->glDeleteProgram)(gears->program);
    }
    pGVar1 = (*gears->glGetString)(0x1f02);
    puts((char *)pGVar1);
    pGVar1 = (*gears->glGetString)(0x8b8c);
    puts((char *)pGVar1);
    if (gears->lib_handle != (void *)0x0) {
      dlclose();
    }
    free(gears);
    return;
  }
  return;
}

Assistant:

static void glesv2_gears_term(gears_t *gears)
{
  if (!gears) {
    return;
  }

  if (gears->gear[GEAR2]) {
    delete_gear(gears, GEAR2);
  }
  if (gears->gear[GEAR1]) {
    delete_gear(gears, GEAR1);
  }
  if (gears->gear[GEAR0]) {
    delete_gear(gears, GEAR0);
  }
  if (gears->program) {
    gears->glDeleteProgram(gears->program);
  }

  printf("%s\n", gears->glGetString(GL_VERSION));
  printf("%s\n", gears->glGetString(GL_SHADING_LANGUAGE_VERSION));

  if (gears->lib_handle) {
    dlclose(gears->lib_handle);
  }

  free(gears);
}